

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O3

void __thiscall QUrlQuery::removeAllQueryItems(QUrlQuery *this,QString *key)

{
  uint uVar1;
  QUrlQueryPrivate *pQVar2;
  pair<QString,_QString> *ppVar3;
  long lVar4;
  pair<QString,_QString> *ppVar5;
  bool bVar6;
  qsizetype qVar7;
  iterator aend;
  iterator iVar8;
  pair<QString,_QString> *ppVar9;
  type __p;
  type ppVar10;
  Map *this_00;
  const_iterator abegin;
  long lVar11;
  long lVar12;
  char16_t *pcVar13;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  QStringView in;
  QStringView rhs;
  QStringView rhs_00;
  QStringView rhs_01;
  QStringView rhs_02;
  QStringView rhs_03;
  QStringView rhs_04;
  QStringView rhs_05;
  QStringView rhs_06;
  QStringView lhs;
  QStringView lhs_00;
  QStringView lhs_01;
  QStringView lhs_02;
  QStringView lhs_03;
  QStringView lhs_04;
  QStringView lhs_05;
  QStringView lhs_06;
  QArrayData *local_68;
  QString local_58;
  undefined4 local_40;
  undefined4 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d).d.ptr == (QUrlQueryPrivate *)0x0) goto LAB_00266fa8;
  QSharedDataPointer<QUrlQueryPrivate>::detach(&this->d);
  pQVar2 = (this->d).d.ptr;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  uVar1._0_2_ = pQVar2->valueDelimiter;
  uVar1._2_2_ = pQVar2->pairDelimiter;
  auVar14 = pshuflw(ZEXT416(uVar1),ZEXT416(uVar1),0xe1);
  local_40 = auVar14._0_4_;
  local_3c = 0x23;
  in.m_data = (key->d).ptr;
  in.m_size = (key->d).size;
  qVar7 = qt_urlRecode(&local_58,in,(ComponentFormattingOptions)0x2000000,(ushort *)&local_40);
  if (qVar7 == 0) {
    local_68 = &((key->d).d)->super_QArrayData;
    pcVar13 = (key->d).ptr;
    qVar7 = (key->d).size;
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_68->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_68->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    local_68 = &(local_58.d.d)->super_QArrayData;
    qVar7 = local_58.d.size;
    pcVar13 = local_58.d.ptr;
  }
  ppVar3 = (pQVar2->itemList).d.ptr;
  lVar4 = (pQVar2->itemList).d.size;
  ppVar9 = ppVar3;
  lVar11 = lVar4;
  if (0 < lVar4 >> 2) {
    lVar12 = (lVar4 >> 2) + 1;
    lVar11 = lVar4 * 0x30;
    ppVar5 = ppVar3 + 2;
    do {
      ppVar9 = ppVar5;
      if ((ppVar9[-2].first.d.size == qVar7) &&
         (rhs.m_data = pcVar13, rhs.m_size = qVar7, lhs.m_data = ppVar9[-2].first.d.ptr,
         lhs.m_size = qVar7, bVar6 = QtPrivate::equalStrings(lhs,rhs), bVar6)) {
        ppVar9 = ppVar9 + -2;
        goto LAB_00266ef7;
      }
      if ((ppVar9[-1].first.d.size == qVar7) &&
         (rhs_00.m_data = pcVar13, rhs_00.m_size = qVar7, lhs_00.m_data = ppVar9[-1].first.d.ptr,
         lhs_00.m_size = qVar7, bVar6 = QtPrivate::equalStrings(lhs_00,rhs_00), bVar6)) {
        ppVar9 = ppVar9 + -1;
        goto LAB_00266ef7;
      }
      if (((ppVar9->first).d.size == qVar7) &&
         (rhs_01.m_data = pcVar13, rhs_01.m_size = qVar7, lhs_01.m_data = (ppVar9->first).d.ptr,
         lhs_01.m_size = qVar7, bVar6 = QtPrivate::equalStrings(lhs_01,rhs_01), bVar6))
      goto LAB_00266ef7;
      if ((ppVar9[1].first.d.size == qVar7) &&
         (rhs_02.m_data = pcVar13, rhs_02.m_size = qVar7, lhs_02.m_data = ppVar9[1].first.d.ptr,
         lhs_02.m_size = qVar7, bVar6 = QtPrivate::equalStrings(lhs_02,rhs_02), bVar6)) {
        ppVar9 = ppVar9 + 1;
        goto LAB_00266ef7;
      }
      lVar12 = lVar12 + -1;
      lVar11 = lVar11 + -0xc0;
      ppVar5 = ppVar9 + 4;
    } while (1 < lVar12);
    lVar11 = (lVar11 >> 4) * -0x5555555555555555;
    ppVar9 = ppVar9 + 2;
  }
  if (lVar11 == 1) {
LAB_00266e73:
    if (((ppVar9->first).d.size != qVar7) ||
       (rhs_05.m_data = pcVar13, rhs_05.m_size = qVar7, lhs_05.m_data = (ppVar9->first).d.ptr,
       lhs_05.m_size = qVar7, bVar6 = QtPrivate::equalStrings(lhs_05,rhs_05), !bVar6)) {
LAB_00266e95:
      ppVar9 = ppVar3 + lVar4;
    }
  }
  else if (lVar11 == 2) {
LAB_00266e49:
    if (((ppVar9->first).d.size != qVar7) ||
       (rhs_04.m_data = pcVar13, rhs_04.m_size = qVar7, lhs_04.m_data = (ppVar9->first).d.ptr,
       lhs_04.m_size = qVar7, bVar6 = QtPrivate::equalStrings(lhs_04,rhs_04), !bVar6)) {
      ppVar9 = ppVar9 + 1;
      goto LAB_00266e73;
    }
  }
  else {
    if (lVar11 != 3) goto LAB_00266e95;
    if (((ppVar9->first).d.size != qVar7) ||
       (rhs_03.m_data = pcVar13, rhs_03.m_size = qVar7, lhs_03.m_data = (ppVar9->first).d.ptr,
       lhs_03.m_size = qVar7, bVar6 = QtPrivate::equalStrings(lhs_03,rhs_03), !bVar6)) {
      ppVar9 = ppVar9 + 1;
      goto LAB_00266e49;
    }
  }
LAB_00266ef7:
  lVar11 = (long)ppVar9 - (long)ppVar3;
  if ((lVar11 >> 4) * -0x5555555555555555 - lVar4 != 0) {
    this_00 = &pQVar2->itemList;
    aend = QList<std::pair<QString,_QString>_>::end(this_00);
    iVar8 = QList<std::pair<QString,_QString>_>::begin(this_00);
    abegin.i = iVar8.i + lVar11;
    ppVar10 = (type)(lVar11 + (long)iVar8.i);
    while (__p = ppVar10 + 1, __p != aend.i) {
      if ((ppVar10[1].first.d.size != qVar7) ||
         (rhs_06.m_data = pcVar13, rhs_06.m_size = qVar7, lhs_06.m_data = ppVar10[1].first.d.ptr,
         lhs_06.m_size = qVar7, bVar6 = QtPrivate::equalStrings(lhs_06,rhs_06), ppVar10 = __p,
         !bVar6)) {
        std::pair<QString,_QString>::operator=(abegin.i,__p);
        abegin.i = abegin.i + 1;
        ppVar10 = __p;
      }
    }
    QList<std::pair<QString,_QString>_>::erase(this_00,abegin,(const_iterator)aend.i);
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,0x10);
    }
  }
LAB_00266fa8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUrlQuery::removeAllQueryItems(const QString &key)
{
    if (d.constData()) {
        auto *p = d.data();
        const QString encodedKey = p->recodeFromUser(key);
        auto firstEqualsEncodedKey = [&encodedKey](const std::pair<QString, QString> &item) {
            return item.first == encodedKey;
        };
        p->itemList.removeIf(firstEqualsEncodedKey);
    }
}